

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

int compareElementRecursive
              (QCborContainerPrivate *c1,Element *e1,QCborContainerPrivate *c2,Element *e2,
              Comparison mode)

{
  Type TVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Type TVar5;
  Type TVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t *psVar10;
  QCborContainerPrivate *pQVar11;
  size_t *psVar12;
  size_t __n;
  size_t sVar13;
  QCborContainerPrivate *pQVar14;
  QCborContainerPrivate *pQVar15;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QUtf8StringView lhs;
  QUtf8StringView lhs_00;
  QStringView lhs_01;
  
  TVar1 = e1->type;
  TVar6 = TVar1;
  if (0xffff < TVar1) {
    TVar6 = Tag;
  }
  TVar5 = e2->type;
  if (0xffff < e2->type) {
    TVar5 = Tag;
  }
  if (TVar6 - TVar5 != 0) {
    return TVar6 - TVar5;
  }
  uVar7 = (e1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  uVar2 = (e2->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  if ((uVar7 & 1) == 0) {
    if ((uVar2 & 1) == 0) {
      if (c1 == (QCborContainerPrivate *)0x0) {
        psVar10 = (size_t *)0x0;
      }
      else {
        uVar3._0_4_ = e1->type;
        uVar3._4_4_ = e1->flags;
        pcVar9 = (c1->data).d.ptr;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = &QByteArray::_empty;
        }
        psVar10 = (size_t *)(pcVar9 + (e1->field_0).value);
        if ((uVar3 & 0x200000000) == 0) {
          psVar10 = (size_t *)0x0;
        }
      }
      if (c2 == (QCborContainerPrivate *)0x0) {
        psVar12 = (size_t *)0x0;
      }
      else {
        uVar4._0_4_ = e2->type;
        uVar4._4_4_ = e2->flags;
        pcVar9 = (c2->data).d.ptr;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = &QByteArray::_empty;
        }
        psVar12 = (size_t *)(pcVar9 + (e2->field_0).value);
        if ((uVar4 & 0x200000000) == 0) {
          psVar12 = (size_t *)0x0;
        }
      }
      if (psVar10 == (size_t *)0x0 && psVar12 == (size_t *)0x0) {
        pQVar11 = (e1->field_0).container;
        pQVar14 = (e2->field_0).container;
        if ((TVar1 == Double) || (TVar1 == Tag)) {
          if (pQVar11 != pQVar14) {
            return -(uint)(pQVar11 < pQVar14) | 1;
          }
        }
        else if (TVar1 == Integer) {
          pQVar15 = (QCborContainerPrivate *)(0x7fffffffffffffff - (long)pQVar11);
          if (-1 < (long)pQVar11) {
            pQVar15 = pQVar11;
          }
          pQVar11 = (QCborContainerPrivate *)(0x7fffffffffffffff - (long)pQVar14);
          if (-1 < (long)pQVar14) {
            pQVar11 = pQVar14;
          }
          if (pQVar15 < pQVar11) {
            return -1;
          }
          if (pQVar11 < pQVar15) {
            return 1;
          }
        }
        uVar7 = 0;
      }
      else {
        if (psVar10 == (size_t *)0x0) {
          __n = 0;
        }
        else {
          __n = *psVar10;
        }
        if (psVar12 == (size_t *)0x0) {
          sVar13 = 0;
        }
        else {
          sVar13 = *psVar12;
          if ((__n != 0) && (sVar13 != 0)) {
            if ((uVar7 & 4) != 0) {
              rhs_01.m_data = (storage_type_conflict *)(psVar12 + 1);
              if ((uVar2 & 4) == 0) {
                rhs.m_data = (storage_type_conflict *)(psVar10 + 1);
                rhs.m_size = (long)*psVar10 / 2;
                lhs.m_size = sVar13;
                lhs.m_data = (storage_type *)rhs_01.m_data;
                iVar8 = compareStringsInUtf8(lhs,rhs,mode);
                return -iVar8;
              }
              rhs_01.m_size = (long)sVar13 / 2;
              lhs_01.m_data = (storage_type_conflict *)(psVar10 + 1);
              lhs_01.m_size = (long)*psVar10 / 2;
              iVar8 = compareStringsInUtf8(lhs_01,rhs_01,mode);
              return iVar8;
            }
            if ((uVar2 & 4) != 0) {
              rhs_00.m_data = (storage_type_conflict *)(psVar12 + 1);
              rhs_00.m_size = (long)sVar13 / 2;
              lhs_00.m_size = *psVar10;
              lhs_00.m_data = (storage_type *)(psVar10 + 1);
              iVar8 = compareStringsInUtf8(lhs_00,rhs_00,mode);
              return iVar8;
            }
            if (__n != sVar13) {
              return (uint)((long)sVar13 <= (long)__n) * 2 + -1;
            }
            if (mode == ForEquality) {
              iVar8 = bcmp(psVar10 + 1,psVar12 + 1,__n);
              return (uint)(iVar8 != 0);
            }
            iVar8 = memcmp(psVar10 + 1,psVar12 + 1,__n);
            return iVar8;
          }
        }
        uVar7 = 0xffffffff;
        if ((long)sVar13 <= (long)__n) {
          uVar7 = (uint)(__n != sVar13);
        }
      }
      return uVar7;
    }
    pQVar11 = (e2->field_0).container;
    pQVar14 = (QCborContainerPrivate *)0x0;
  }
  else {
    if ((uVar2 & 1) == 0) {
      pQVar11 = (QCborContainerPrivate *)0x0;
    }
    else {
      pQVar11 = (e2->field_0).container;
    }
    pQVar14 = (e1->field_0).container;
  }
  iVar8 = compareContainer(pQVar14,pQVar11,mode);
  return iVar8;
}

Assistant:

static int compareElementRecursive(const QCborContainerPrivate *c1, const Element &e1,
                                   const QCborContainerPrivate *c2, const Element &e2,
                                   Comparison mode) noexcept
{
    int cmp = typeOrder(e1.type, e2.type);
    if (cmp != 0)
        return cmp;

    if ((e1.flags & Element::IsContainer) || (e2.flags & Element::IsContainer))
        return compareContainer(e1.flags & Element::IsContainer ? e1.container : nullptr,
                                e2.flags & Element::IsContainer ? e2.container : nullptr, mode);

    // string data?
    const ByteData *b1 = c1 ? c1->byteData(e1) : nullptr;
    const ByteData *b2 = c2 ? c2->byteData(e2) : nullptr;
    if (b1 || b2) {
        auto len1 = b1 ? b1->len : 0;
        auto len2 = b2 ? b2->len : 0;
        if (len1 == 0 || len2 == 0)
            return len1 < len2 ? -1 : len1 == len2 ? 0 : 1;

        // we definitely have data from this point forward
        Q_ASSERT(b1);
        Q_ASSERT(b2);

        // Officially with CBOR, we sort first the string with the shortest
        // UTF-8 length. Since US-ASCII is just a subset of UTF-8, its length
        // is the UTF-8 length. But the UTF-16 length may not be directly
        // comparable.
        if ((e1.flags & Element::StringIsUtf16) && (e2.flags & Element::StringIsUtf16))
            return compareStringsInUtf8(b1->asStringView(), b2->asStringView(), mode);

        if (!(e1.flags & Element::StringIsUtf16) && !(e2.flags & Element::StringIsUtf16)) {
            // Neither is UTF-16, so lengths are comparable too
            // (this case includes byte arrays too)
            if (len1 == len2) {
                if (mode == Comparison::ForEquality) {
                    // GCC optimizes this to __memcmpeq(); Clang to bcmp()
                    return memcmp(b1->byte(), b2->byte(), size_t(len1)) == 0 ? 0 : 1;
                }
                return memcmp(b1->byte(), b2->byte(), size_t(len1));
            }
            return len1 < len2 ? -1 : 1;
        }

        // Only one is UTF-16
        if (e1.flags & Element::StringIsUtf16)
            return compareStringsInUtf8(b1->asStringView(), b2->asUtf8StringView(), mode);
        else
            return compareStringsInUtf8(b1->asUtf8StringView(), b2->asStringView(), mode);
    }

    return compareElementNoData(e1, e2);
}